

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<double> * __thiscall
google::protobuf::util::converter::DataPiece::StringToNumber<double>
          (StatusOr<double> *__return_storage_ptr__,DataPiece *this,
          _func_bool_StringPiece_double_ptr *func)

{
  anon_union_16_8_b72e7a25_for_DataPiece_3 *this_00;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  AlphaNum *pAVar4;
  string *this_01;
  AlphaNum *in_R8;
  StringPiece SVar5;
  StringPiece value_str;
  char *local_130;
  undefined8 local_128;
  AlphaNum local_100;
  AlphaNum local_d0;
  string local_a0;
  undefined1 local_80 [40];
  string local_58;
  double local_38;
  double result;
  
  this_00 = &this->field_2;
  if (((this->field_2).str_.size_ < 1) ||
     ((cVar1 = protobuf::internal::StringPiecePod::operator[](&this_00->str_,0), cVar1 != ' ' &&
      (cVar1 = protobuf::internal::StringPiecePod::operator[]
                         (&this_00->str_,(this->field_2).str_.size_ + -1), cVar1 != ' ')))) {
    SVar5 = protobuf::internal::StringPiecePod::operator_cast_to_StringPiece(&this_00->str_);
    bVar2 = (*func)(SVar5,&local_38);
    if (bVar2) {
      StatusOr<double>::StatusOr(__return_storage_ptr__,&local_38);
      return __return_storage_ptr__;
    }
    local_130 = "\"";
    local_128 = 1;
    protobuf::internal::StringPiecePod::ToString_abi_cxx11_(&local_a0,&this_00->str_);
    local_100.piece_data_ = local_a0._M_dataplus._M_p;
    local_100.piece_size_ = local_a0._M_string_length;
    pAVar4 = &local_d0;
    local_d0.piece_data_ = "\"";
    local_d0.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_130,&local_100,pAVar4,in_R8);
    pcVar3 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_58._M_string_length);
    SVar5.length_ = (stringpiece_ssize_type)pAVar4;
    SVar5.ptr_ = pcVar3;
    anon_unknown_1::InvalidArgument
              ((Status *)local_80,(anon_unknown_1 *)local_58._M_dataplus._M_p,SVar5);
    StatusOr<double>::StatusOr(__return_storage_ptr__,(Status *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_58);
    this_01 = &local_a0;
  }
  else {
    local_130 = "\"";
    local_128 = 1;
    local_100.piece_data_ = (char *)(this->field_2).i64_;
    local_100.piece_size_ = (this->field_2).str_.size_;
    pAVar4 = &local_d0;
    local_d0.piece_data_ = "\"";
    local_d0.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_130,&local_100,pAVar4,in_R8);
    pcVar3 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_58._M_string_length);
    value_str.length_ = (stringpiece_ssize_type)pAVar4;
    value_str.ptr_ = pcVar3;
    anon_unknown_1::InvalidArgument
              ((Status *)local_80,(anon_unknown_1 *)local_58._M_dataplus._M_p,value_str);
    StatusOr<double>::StatusOr(__return_storage_ptr__,(Status *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    this_01 = &local_58;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> DataPiece::StringToNumber(bool (*func)(StringPiece,
                                                    To*)) const {
  if (str_.size() > 0 && (str_[0] == ' ' || str_[str_.size() - 1] == ' ')) {
    return InvalidArgument(StrCat("\"", str_, "\""));
  }
  To result;
  if (func(str_, &result)) return result;
  return InvalidArgument(StrCat("\"", std::string(str_), "\""));
}